

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

dropt_context * dropt_new_context(dropt_option *options)

{
  _Bool _Var1;
  char *pcVar2;
  dropt_context *context;
  dropt_option *option;
  size_t sVar3;
  
  if (options == (dropt_option *)0x0) {
    dropt_misuse("No option list specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                 ,0x58d);
  }
  sVar3 = 0;
  option = options;
  while( true ) {
    _Var1 = is_valid_option(option);
    if (!_Var1) {
      context = (dropt_context *)calloc(1,0x60);
      if (context != (dropt_context *)0x0) {
        context->options = options;
        context->numOptions = sVar3;
        context->ncmpstr = strncmp;
        free_lookup_tables(context);
      }
      return context;
    }
    if (option->short_name == '=') break;
    if (option->long_name != (char *)0x0) {
      pcVar2 = strchr(option->long_name,0x3d);
      if (pcVar2 != (char *)0x0) break;
    }
    sVar3 = sVar3 + 1;
    option = option + 1;
  }
  dropt_misuse("Invalid option list. \'=\' may not be used in an option name.",
               "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c",
               0x598);
}

Assistant:

dropt_context*
dropt_new_context(const dropt_option* options)
{
    dropt_context* context = NULL;
    size_t n;

    if (options == NULL)
    {
        DROPT_MISUSE("No option list specified.");
        goto exit;
    }

    /* Sanity-check the options. */
    for (n = 0; is_valid_option(&options[n]); n++)
    {
        if (   options[n].short_name == DROPT_TEXT_LITERAL('=')
            || (   options[n].long_name != NULL
                && dropt_strchr(options[n].long_name, DROPT_TEXT_LITERAL('=')) != NULL))
        {
            DROPT_MISUSE("Invalid option list. '=' may not be used in an option name.");
            goto exit;
        }
    }

    context = malloc(sizeof *context);
    if (context == NULL)
    {
        goto exit;
    }
    else
    {
        dropt_context emptyContext = { 0 };
        *context = emptyContext;

        context->options = options;
        context->numOptions = n;
        dropt_set_strncmp(context, NULL);
    }

exit:
    return context;
}